

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O0

void __thiscall Ui_MainWindow::retranslateUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  QString local_b8;
  QString local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_30;
  QMainWindow *local_18;
  QMainWindow *MainWindow_local;
  Ui_MainWindow *this_local;
  
  local_18 = MainWindow;
  MainWindow_local = (QMainWindow *)this;
  QCoreApplication::translate((char *)&local_30,"MainWindow","MainWindow",0);
  QWidget::setWindowTitle((QString *)MainWindow);
  QString::~QString(&local_30);
  pQVar1 = this->beginNewGameButton;
  QCoreApplication::translate((char *)&local_58,"MainWindow","Begin new game",0);
  QAbstractButton::setText((QString *)pQVar1);
  QString::~QString(&local_58);
  pQVar2 = this->player1Label;
  QCoreApplication::translate((char *)&local_70,"MainWindow","Player 1",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_70);
  pQVar2 = this->player1Score;
  QCoreApplication::translate((char *)&local_88,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_88);
  pQVar2 = this->player2Label;
  QCoreApplication::translate((char *)&local_a0,"MainWindow","Player 2",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_a0);
  pQVar2 = this->player2Score;
  QCoreApplication::translate((char *)&local_b8,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_b8);
  return;
}

Assistant:

void retranslateUi(QMainWindow *MainWindow)
    {
        MainWindow->setWindowTitle(QCoreApplication::translate("MainWindow", "MainWindow", nullptr));
        beginNewGameButton->setText(QCoreApplication::translate("MainWindow", "Begin new game", nullptr));
        player1Label->setText(QCoreApplication::translate("MainWindow", "Player 1", nullptr));
        player1Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
        player2Label->setText(QCoreApplication::translate("MainWindow", "Player 2", nullptr));
        player2Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
    }